

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Generator.cpp
# Opt level: O0

EStatusCode __thiscall MD5Generator::Accumulate(MD5Generator *this,ByteList *inString)

{
  bool bVar1;
  size_type sVar2;
  _List_node_base *inBlock;
  reference puVar3;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  Byte *itBuffer;
  Byte *buffer;
  ByteList *inString_local;
  MD5Generator *this_local;
  
  if ((this->mIsFinalized & 1U) == 0) {
    sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size(inString);
    inBlock = (_List_node_base *)operator_new__(sVar2);
    it._M_node = inBlock;
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::begin(inString);
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::end(inString);
      bVar1 = std::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      puVar3 = std::_List_const_iterator<unsigned_char>::operator*(&local_38);
      *(uchar *)&(it._M_node)->_M_next = *puVar3;
      std::_List_const_iterator<unsigned_char>::operator++(&local_38);
      it._M_node = (_List_node_base *)((long)&(it._M_node)->_M_next + 1);
    }
    sVar2 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::size(inString);
    _Accumulate(this,(uint1 *)inBlock,sVar2);
    if (inBlock != (_List_node_base *)0x0) {
      operator_delete__(inBlock);
    }
    this_local._4_4_ = eSuccess;
  }
  else {
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode MD5Generator::Accumulate(const ByteList& inString)
{
	if(mIsFinalized)
		return PDFHummus::eFailure;

	Byte* buffer = new Byte[inString.size()];
	Byte* itBuffer = buffer;
	ByteList::const_iterator it = inString.begin();
	for (; it != inString.end(); ++it,++itBuffer)
		*itBuffer = *it;
	
	_Accumulate((const uint1*)buffer,(unsigned long)inString.size());
	delete[] buffer;
	return PDFHummus::eSuccess;

}